

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_block_compression_hdr * cram_new_compression_header(void)

{
  cram_block *pcVar1;
  kh_m_s2i_t *pkVar2;
  string_alloc_t *psVar3;
  cram_block_compression_hdr *hdr;
  
  hdr = (cram_block_compression_hdr *)calloc(1,0x418);
  if (hdr == (cram_block_compression_hdr *)0x0) {
    hdr = (cram_block_compression_hdr *)0x0;
  }
  else {
    pcVar1 = cram_new_block(CORE,0);
    hdr->TD_blk = pcVar1;
    if (pcVar1 == (cram_block *)0x0) {
      free(hdr);
      hdr = (cram_block_compression_hdr *)0x0;
    }
    else {
      pkVar2 = kh_init_m_s2i();
      hdr->TD_hash = pkVar2;
      if (pkVar2 == (kh_m_s2i_t *)0x0) {
        cram_free_block(hdr->TD_blk);
        free(hdr);
        hdr = (cram_block_compression_hdr *)0x0;
      }
      else {
        psVar3 = string_pool_create(0x2000);
        hdr->TD_keys = psVar3;
        if (psVar3 == (string_alloc_t *)0x0) {
          kh_destroy_m_s2i(hdr->TD_hash);
          cram_free_block(hdr->TD_blk);
          free(hdr);
          hdr = (cram_block_compression_hdr *)0x0;
        }
      }
    }
  }
  return hdr;
}

Assistant:

cram_block_compression_hdr *cram_new_compression_header(void) {
    cram_block_compression_hdr *hdr = calloc(1, sizeof(*hdr));
    if (!hdr)
	return NULL;

    if (!(hdr->TD_blk = cram_new_block(CORE, 0))) {
	free(hdr);
	return NULL;
    }

    if (!(hdr->TD_hash = kh_init(m_s2i))) {
	cram_free_block(hdr->TD_blk);
	free(hdr);
	return NULL;
    }

    if (!(hdr->TD_keys = string_pool_create(8192))) {
	kh_destroy(m_s2i, hdr->TD_hash);
	cram_free_block(hdr->TD_blk);
	free(hdr);
	return NULL;
    }

    return hdr;
}